

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedPtrField<proto2_unittest::TestConflictingSymbolNames_Data4>::
RepeatedPtrField(RepeatedPtrField<proto2_unittest::TestConflictingSymbolNames_Data4> *this,
                Arena *param_2,RepeatedPtrFieldBase *param_3)

{
  (this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ = (void *)0x0;
  (this->super_RepeatedPtrFieldBase).current_size_ = 0;
  (this->super_RepeatedPtrFieldBase).capacity_proxy_ = 0;
  (this->super_RepeatedPtrFieldBase).arena_ = param_2;
  if (param_3->current_size_ != 0) {
    protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              (&this->super_RepeatedPtrFieldBase,param_3,
               Arena::CopyConstruct<proto2_unittest::TestConflictingSymbolNames_Data4>);
  }
  return;
}

Assistant:

explicit RepeatedPtrFieldBase(Arena* arena)
      : tagged_rep_or_elem_(nullptr),
        current_size_(0),
        capacity_proxy_(0),
        arena_(arena) {}